

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_window_close(nk_context *ctx,char *name)

{
  byte *pbVar1;
  nk_window *pnVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x40b3,"void nk_window_close(struct nk_context *, const char *)");
  }
  pnVar2 = nk_window_find(ctx,name);
  if (pnVar2 != (nk_window *)0x0) {
    if (ctx->current == pnVar2) {
      __assert_fail("ctx->current != win && \"You cannot close a currently active window\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x40b7,"void nk_window_close(struct nk_context *, const char *)");
    }
    pbVar1 = (byte *)((long)&pnVar2->flags + 1);
    *pbVar1 = *pbVar1 | 0x60;
  }
  return;
}

Assistant:

NK_API void
nk_window_close(struct nk_context *ctx, const char *name)
{
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return;
    win = nk_window_find(ctx, name);
    if (!win) return;
    NK_ASSERT(ctx->current != win && "You cannot close a currently active window");
    if (ctx->current == win) return;
    win->flags |= NK_WINDOW_HIDDEN;
    win->flags |= NK_WINDOW_CLOSED;
}